

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameParentFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  sqlite3 *db_00;
  uchar *zLeft;
  uchar *puVar2;
  char *z_00;
  sqlite3_context *in_RDI;
  char *zOut;
  char *zParent;
  int token;
  int n;
  uchar *z;
  uchar *zNew;
  uchar *zOld;
  uchar *zInput;
  char *zResult;
  char *zOutput;
  sqlite3 *db;
  void *in_stack_ffffffffffffff78;
  sqlite3 *in_stack_ffffffffffffff80;
  sqlite3 *in_stack_ffffffffffffff88;
  sqlite3 *in_stack_ffffffffffffff90;
  sqlite3 *in_stack_ffffffffffffff98;
  int local_58;
  int local_54;
  uchar *local_50;
  uchar *local_38;
  sqlite3 *local_28;
  
  db_00 = sqlite3_context_db_handle(in_RDI);
  local_28 = (sqlite3 *)0x0;
  local_50 = sqlite3_value_text((sqlite3_value *)0x1afe80);
  zLeft = sqlite3_value_text((sqlite3_value *)0x1afe93);
  puVar2 = sqlite3_value_text((sqlite3_value *)0x1afea6);
  if ((local_50 != (uchar *)0x0) && (local_38 = local_50, zLeft != (uchar *)0x0)) {
    for (; *local_50 != '\0'; local_50 = local_50 + local_54) {
      local_54 = sqlite3GetToken((uchar *)in_stack_ffffffffffffff98,(int *)in_stack_ffffffffffffff90
                                );
      if (local_58 == 0x69) {
        local_50 = local_50 + local_54;
        local_54 = sqlite3GetToken((uchar *)in_stack_ffffffffffffff98,
                                   (int *)in_stack_ffffffffffffff90);
        z_00 = sqlite3DbStrNDup(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                (u64)in_stack_ffffffffffffff78);
        if (z_00 == (char *)0x0) break;
        sqlite3Dequote(z_00);
        iVar1 = sqlite3_stricmp((char *)zLeft,z_00);
        if (iVar1 == 0) {
          in_stack_ffffffffffffff88 = local_28;
          if (local_28 == (sqlite3 *)0x0) {
            in_stack_ffffffffffffff88 = (sqlite3 *)0x1e291f;
          }
          in_stack_ffffffffffffff90 = db_00;
          in_stack_ffffffffffffff98 =
               (sqlite3 *)
               sqlite3MPrintf(db_00,"%s%.*s\"%w\"",in_stack_ffffffffffffff88,
                              (ulong)(uint)((int)local_50 - (int)local_38),local_38,puVar2);
          sqlite3DbFree(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          local_38 = local_50 + local_54;
          local_28 = in_stack_ffffffffffffff98;
        }
        sqlite3DbFree(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
    }
    if (local_28 == (sqlite3 *)0x0) {
      local_28 = (sqlite3 *)0x1e291f;
    }
    sqlite3MPrintf(db_00,"%s%s",local_28,local_38);
    sqlite3_result_text((sqlite3_context *)in_stack_ffffffffffffff90,
                        (char *)in_stack_ffffffffffffff88,(int)((ulong)db_00 >> 0x20),
                        (_func_void_void_ptr *)local_28);
    sqlite3DbFree(db_00,local_28);
  }
  return;
}

Assistant:

static void renameParentFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zOutput = 0;
  char *zResult;
  unsigned char const *zInput = sqlite3_value_text(argv[0]);
  unsigned char const *zOld = sqlite3_value_text(argv[1]);
  unsigned char const *zNew = sqlite3_value_text(argv[2]);

  unsigned const char *z;         /* Pointer to token */
  int n;                          /* Length of token z */
  int token;                      /* Type of token */

  UNUSED_PARAMETER(NotUsed);
  if( zInput==0 || zOld==0 ) return;
  for(z=zInput; *z; z=z+n){
    n = sqlite3GetToken(z, &token);
    if( token==TK_REFERENCES ){
      char *zParent;
      do {
        z += n;
        n = sqlite3GetToken(z, &token);
      }while( token==TK_SPACE );

      zParent = sqlite3DbStrNDup(db, (const char *)z, n);
      if( zParent==0 ) break;
      sqlite3Dequote(zParent);
      if( 0==sqlite3StrICmp((const char *)zOld, zParent) ){
        char *zOut = sqlite3MPrintf(db, "%s%.*s\"%w\"", 
            (zOutput?zOutput:""), (int)(z-zInput), zInput, (const char *)zNew
        );
        sqlite3DbFree(db, zOutput);
        zOutput = zOut;
        zInput = &z[n];
      }
      sqlite3DbFree(db, zParent);
    }
  }

  zResult = sqlite3MPrintf(db, "%s%s", (zOutput?zOutput:""), zInput), 
  sqlite3_result_text(context, zResult, -1, SQLITE_DYNAMIC);
  sqlite3DbFree(db, zOutput);
}